

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_sqrt(secp256k1_fe *a,secp256k1_fe *k)

{
  uint uVar1;
  int iVar2;
  secp256k1_fe *psVar3;
  uint64_t *t;
  secp256k1_fe *psVar4;
  secp256k1_fe *r;
  uint64_t uVar5;
  secp256k1_fe sStack_120;
  secp256k1_fe sStack_f0;
  secp256k1_fe *psStack_c0;
  secp256k1_fe local_98;
  secp256k1_fe local_68;
  uint64_t local_38;
  uint64_t uStack_30;
  uint64_t local_28;
  uint64_t uStack_20;
  
  r = &local_98;
  psVar3 = &local_98;
  psVar4 = &local_68;
  uVar1 = secp256k1_fe_sqrt(psVar4,a);
  if (uVar1 == (k == (secp256k1_fe *)0x0)) {
    test_sqrt_cold_6();
LAB_0014bbeb:
    test_sqrt_cold_5();
LAB_0014bbf0:
    test_sqrt_cold_4();
LAB_0014bbf5:
    r = psVar4;
    psVar3 = k;
    test_sqrt_cold_3();
  }
  else {
    if (k == (secp256k1_fe *)0x0) {
      return;
    }
    secp256k1_fe_verify(&local_68);
    a = (secp256k1_fe *)0x1;
    secp256k1_fe_verify_magnitude(&local_68,1);
    local_98.n[0] = 0x3ffffbfffff0bc - local_68.n[0];
    local_98.n[1] = 0x3ffffffffffffc - local_68.n[1];
    local_98.n[2] = 0x3ffffffffffffc - local_68.n[2];
    local_98.n[3] = 0x3ffffffffffffc - local_68.n[3];
    uVar5 = 0x3fffffffffffc - local_68.n[4];
    local_98.magnitude = 2;
    local_98.normalized = 0;
    local_98.n[4] = uVar5;
    local_38 = local_98.n[2];
    uStack_30 = local_98.n[3];
    local_28 = local_98.n[0];
    uStack_20 = local_98.n[1];
    secp256k1_fe_verify(&local_98);
    secp256k1_fe_verify(&local_68);
    psVar4 = k;
    secp256k1_fe_verify(k);
    iVar2 = k->magnitude + local_68.magnitude;
    if (0x20 < iVar2) goto LAB_0014bbeb;
    local_68.n[0] = k->n[0] + local_68.n[0];
    local_68.n[1] = k->n[1] + local_68.n[1];
    local_68.n[2] = k->n[2] + local_68.n[2];
    local_68.n[3] = k->n[3] + local_68.n[3];
    local_68.n[4] = local_68.n[4] + k->n[4];
    local_68.normalized = 0;
    local_68.magnitude = iVar2;
    secp256k1_fe_verify(&local_68);
    secp256k1_fe_verify(&local_98);
    psVar4 = k;
    secp256k1_fe_verify(k);
    if (0x1e < k->magnitude) goto LAB_0014bbf0;
    local_98.n[0] = k->n[0] + local_28;
    local_98.n[1] = k->n[1] + uStack_20;
    local_98.n[2] = k->n[2] + local_38;
    local_98.n[3] = k->n[3] + uStack_30;
    local_98.n[4] = uVar5 + k->n[4];
    local_98.normalized = 0;
    local_98.magnitude = k->magnitude + 2;
    secp256k1_fe_verify(&local_98);
    secp256k1_fe_normalize(&local_68);
    secp256k1_fe_normalize(&local_98);
    psVar4 = &local_68;
    secp256k1_fe_verify(&local_68);
    k = &local_68;
    if (local_68.normalized == 0) goto LAB_0014bbf5;
    if (((local_68.n[1] == 0 && local_68.n[3] == 0) && (local_68.n[0] == 0 && local_68.n[2] == 0))
        && local_68.n[4] == 0) {
      return;
    }
    secp256k1_fe_verify(&local_98);
    if (local_98.normalized != 0) {
      psVar3 = &local_98;
      if (((local_98.n[1] == 0 && local_98.n[3] == 0) && (local_98.n[0] == 0 && local_98.n[2] == 0))
          && local_98.n[4] == 0) {
        return;
      }
      goto LAB_0014bbff;
    }
  }
  test_sqrt_cold_2();
LAB_0014bbff:
  test_sqrt_cold_1();
  psVar4 = r + 2;
  psStack_c0 = psVar3;
  testutil_random_fe_non_zero_test(psVar4);
  secp256k1_fe_sqr(&sStack_f0,psVar4);
  secp256k1_fe_mul(&sStack_120,&sStack_f0,psVar4);
  secp256k1_fe_mul(r,a,&sStack_f0);
  secp256k1_fe_mul(r + 1,a + 1,&sStack_120);
  *(int *)r[3].n = (int)a[2].n[0];
  return;
}

Assistant:

static void test_sqrt(const secp256k1_fe *a, const secp256k1_fe *k) {
    secp256k1_fe r1, r2;
    int v = secp256k1_fe_sqrt(&r1, a);
    CHECK((v == 0) == (k == NULL));

    if (k != NULL) {
        /* Check that the returned root is +/- the given known answer */
        secp256k1_fe_negate(&r2, &r1, 1);
        secp256k1_fe_add(&r1, k); secp256k1_fe_add(&r2, k);
        secp256k1_fe_normalize(&r1); secp256k1_fe_normalize(&r2);
        CHECK(secp256k1_fe_is_zero(&r1) || secp256k1_fe_is_zero(&r2));
    }
}